

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

listNode * __thiscall rlist::listLast(rlist *this)

{
  rlist *this_local;
  
  if (this->rl->head == (listNode *)0x0) {
    this_local = (rlist *)0x0;
  }
  else if (this->rl->head->next == (listNode *)0x0) {
    this_local = (rlist *)this->rl->head;
  }
  else {
    this->view = this->rl->head;
    while (this->view->next != (listNode *)0x0) {
      this->view = this->view->next;
    }
    this_local = (rlist *)this->view;
  }
  return (listNode *)this_local;
}

Assistant:

listNode * rlist::listLast(){
    if(rl->head!=NULL){
        if(rl->head->next!=NULL){
            view=rl->head;
            while(view->next!=NULL){
                view=view->next;
            }
            return view;
        }else{
            return rl->head;
        }
    }
    return NULL;
}